

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::SoPlexBase<double>::parseSettingsString(SoPlexBase<double> *this,char *string)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  SPxOut *pSVar5;
  long lVar6;
  size_t sVar7;
  unsigned_long uVar8;
  ulong uVar9;
  Verbosity old_verbosity;
  Verbosity VVar10;
  char *pcVar11;
  Verbosity old_verbosity_7;
  byte *t;
  long lVar12;
  byte *pbVar13;
  undefined8 *puVar14;
  byte *__s1;
  byte *pbVar15;
  double value;
  char parseString [500];
  string local_250;
  double local_230;
  byte local_228 [504];
  
  if (string == (char *)0x0) {
    return false;
  }
  t = local_228;
  spxSnprintf((char *)t,499,"%s",string);
  for (; uVar9 = (ulong)*t, __s1 = t, uVar9 < 0x24; t = t + 1) {
    if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) {
        return true;
      }
      break;
    }
  }
  do {
    do {
      pbVar15 = __s1;
      __s1 = pbVar15 + 1;
      uVar9 = (ulong)*pbVar15;
    } while (0x3a < uVar9);
    if ((0x900002601U >> (uVar9 & 0x3f) & 1) != 0) {
      *pbVar15 = 0;
      pbVar15 = __s1;
      goto LAB_001a019b;
    }
  } while (uVar9 != 0x3a);
  *pbVar15 = 0;
LAB_001a01e9:
  do {
    uVar9 = (ulong)*__s1;
    pbVar15 = __s1;
    if (0x23 < uVar9) goto LAB_001a024e;
    if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) {
        VVar10 = (this->spxout).m_verbosity;
        if ((int)VVar10 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Error parsing setting string: no parameter name.\n",
                   0x31);
        goto LAB_001a0231;
      }
      goto LAB_001a024e;
    }
    __s1 = __s1 + 1;
  } while( true );
  while ((bVar1 == 9 || (bVar1 == 0xd))) {
LAB_001a019b:
    __s1 = pbVar15 + 1;
    bVar1 = *pbVar15;
    pbVar15 = __s1;
    if (0x1f < bVar1) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x3a) goto LAB_001a01e9;
        break;
      }
      goto LAB_001a019b;
    }
  }
  VVar10 = (this->spxout).m_verbosity;
  if ((int)VVar10 < 3) {
    return false;
  }
  pSVar5 = &this->spxout;
  (this->spxout).m_verbosity = INFO1;
  pcVar11 = "Error parsing setting string: no \':\' separating parameter type and name.\n";
  goto LAB_001a01d8;
  while (uVar9 != 0x3d) {
LAB_001a024e:
    do {
      pbVar13 = pbVar15;
      pbVar15 = pbVar13 + 1;
      uVar9 = (ulong)*pbVar13;
    } while (0x3d < uVar9);
    if ((0x900002601U >> (uVar9 & 0x3f) & 1) != 0) {
      *pbVar13 = 0;
      pbVar13 = pbVar15;
      goto LAB_001a026f;
    }
  }
  *pbVar13 = 0;
LAB_001a02bb:
  do {
    uVar9 = (ulong)*pbVar15;
    pbVar13 = pbVar15;
    if (0x23 < uVar9) goto LAB_001a030c;
    if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) {
        VVar10 = (this->spxout).m_verbosity;
        if ((int)VVar10 < 3) {
          return false;
        }
        pSVar5 = &this->spxout;
        (this->spxout).m_verbosity = INFO1;
        pcVar11 = "Error parsing setting string: no parameter value.\n";
        goto LAB_001a01d8;
      }
      goto LAB_001a030c;
    }
    pbVar15 = pbVar15 + 1;
  } while( true );
  while ((bVar1 == 9 || (bVar1 == 0xd))) {
LAB_001a026f:
    pbVar15 = pbVar13 + 1;
    bVar1 = *pbVar13;
    pbVar13 = pbVar15;
    if (0x1f < bVar1) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x3d) goto LAB_001a02bb;
        break;
      }
      goto LAB_001a026f;
    }
  }
  VVar10 = (this->spxout).m_verbosity;
  if ((int)VVar10 < 3) {
    return false;
  }
  pSVar5 = &this->spxout;
  (this->spxout).m_verbosity = INFO1;
  pcVar11 = "Error parsing setting string: no \'=\' after parameter name.\n";
  goto LAB_001a01d8;
LAB_001a032c:
  uVar9 = (ulong)*pbVar13;
  if (0x23 < uVar9) goto LAB_001a0439;
  if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001a035a;
    goto LAB_001a0439;
  }
  pbVar13 = pbVar13 + 1;
  goto LAB_001a032c;
LAB_001a0439:
  VVar10 = (this->spxout).m_verbosity;
  if ((int)VVar10 < 3) {
    return false;
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar5 = soplex::operator<<(&this->spxout,"Error parsing setting string: additional character \'")
  ;
  local_250._M_dataplus._M_p._0_1_ = *pbVar13;
  std::__ostream_insert<char,std::char_traits<char>>
            (pSVar5->m_streams[pSVar5->m_verbosity],(char *)&local_250,1);
  pcVar11 = "\' after parameter value.\n";
  goto LAB_001a01d8;
  while (uVar9 != 0) {
LAB_001a030c:
    do {
      pbVar2 = pbVar13;
      pbVar13 = pbVar2 + 1;
      uVar9 = (ulong)*pbVar2;
    } while (0x23 < uVar9);
    if ((0x900002600U >> (uVar9 & 0x3f) & 1) != 0) {
      *pbVar2 = 0;
      goto LAB_001a032c;
    }
  }
LAB_001a035a:
  iVar4 = strncmp((char *)t,"bool",4);
  if (iVar4 == 0) {
    puVar14 = &Settings::boolParam;
    lVar12 = 0;
    do {
      iVar4 = strncmp((char *)__s1,(char *)*puVar14,500);
      if (iVar4 == 0) {
        iVar4 = strncasecmp((char *)pbVar15,"true",4);
        bVar3 = true;
        if (iVar4 == 0) {
LAB_001a0880:
          bVar3 = setBoolParam(this,(BoolParam)lVar12,bVar3,true);
          if (bVar3) {
            return true;
          }
        }
        else {
          iVar4 = strncasecmp((char *)pbVar15,"TRUE",4);
          bVar3 = true;
          if (iVar4 == 0) goto LAB_001a0880;
          iVar4 = strncasecmp((char *)pbVar15,"t",4);
          bVar3 = true;
          if (iVar4 == 0) goto LAB_001a0880;
          iVar4 = strncasecmp((char *)pbVar15,"T",4);
          bVar3 = true;
          if (iVar4 == 0) goto LAB_001a0880;
          lVar6 = strtol((char *)pbVar15,(char **)0x0,4);
          bVar3 = true;
          if (lVar6 == 1) goto LAB_001a0880;
          iVar4 = strncasecmp((char *)pbVar15,"false",5);
          if ((((iVar4 == 0) || (iVar4 = strncasecmp((char *)pbVar15,"FALSE",5), iVar4 == 0)) ||
              (iVar4 = strncasecmp((char *)pbVar15,"f",5), iVar4 == 0)) ||
             (iVar4 = strncasecmp((char *)pbVar15,"F",5), iVar4 == 0)) {
            bVar3 = false;
            goto LAB_001a0880;
          }
          bVar3 = false;
          lVar6 = strtol((char *)pbVar15,(char **)0x0,5);
          if (lVar6 == 0) goto LAB_001a0880;
        }
        VVar10 = (this->spxout).m_verbosity;
        if ((int)VVar10 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar5 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <");
        pSVar5 = soplex::operator<<(pSVar5,(char *)pbVar15);
        pcVar11 = "> for bool parameter <";
        goto LAB_001a08d4;
      }
      lVar12 = lVar12 + 1;
      puVar14 = puVar14 + 4;
    } while (lVar12 != 0x1a);
LAB_001a061f:
    VVar10 = (this->spxout).m_verbosity;
    if ((int)VVar10 < 3) {
      return false;
    }
    pSVar5 = &this->spxout;
    (this->spxout).m_verbosity = INFO1;
    pcVar11 = "Error parsing setting string: unknown parameter name <";
  }
  else {
    iVar4 = strncmp((char *)t,"int",3);
    if (iVar4 == 0) {
      puVar14 = &Settings::intParam;
      lVar12 = 0;
      do {
        iVar4 = strncmp((char *)__s1,(char *)*puVar14,500);
        if (iVar4 == 0) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          sVar7 = strlen((char *)pbVar15);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,pbVar15,pbVar15 + sVar7);
          iVar4 = std::__cxx11::stoi(&local_250,(size_t *)0x0,10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          bVar3 = setIntParam(this,(IntParam)lVar12,iVar4,false);
          if (bVar3) {
            return bVar3;
          }
          VVar10 = (this->spxout).m_verbosity;
          if ((int)VVar10 < 3) {
            return bVar3;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar5 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <")
          ;
          pSVar5 = soplex::operator<<(pSVar5,(char *)pbVar15);
          pcVar11 = "> for int parameter <";
          goto LAB_001a07c4;
        }
        lVar12 = lVar12 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar12 != 0x1c);
      goto LAB_001a061f;
    }
    iVar4 = strncmp((char *)t,"real",4);
    if (iVar4 == 0) {
      puVar14 = &Settings::realParam;
      lVar12 = 0;
      do {
        iVar4 = strncmp((char *)__s1,(char *)*puVar14,500);
        if (iVar4 == 0) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          sVar7 = strlen((char *)pbVar15);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,pbVar15,pbVar15 + sVar7);
          value = std::__cxx11::stod(&local_250,(size_t *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            local_230 = value;
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
            value = local_230;
          }
          bVar3 = setRealParam(this,(RealParam)lVar12,value,true);
          if (bVar3) {
            return bVar3;
          }
          VVar10 = (this->spxout).m_verbosity;
          if ((int)VVar10 < 3) {
            return bVar3;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar5 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <")
          ;
          pSVar5 = soplex::operator<<(pSVar5,(char *)pbVar15);
          pcVar11 = "> for real parameter <";
LAB_001a07c4:
          pSVar5 = soplex::operator<<(pSVar5,pcVar11);
          pSVar5 = soplex::operator<<(pSVar5,(char *)__s1);
          soplex::operator<<(pSVar5,">.\n");
          (this->spxout).m_verbosity = VVar10;
          return bVar3;
        }
        lVar12 = lVar12 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar12 != 0x1b);
      goto LAB_001a061f;
    }
    iVar4 = strncmp((char *)t,"uint",4);
    if (iVar4 == 0) {
      iVar4 = strncmp((char *)__s1,"random_seed",0xb);
      if (iVar4 == 0) {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        sVar7 = strlen((char *)pbVar15);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,pbVar15,pbVar15 + sVar7);
        uVar8 = std::__cxx11::stoul(&local_250,(size_t *)0x0,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (uVar8 >> 0x20 != 0) {
          VVar10 = (this->spxout).m_verbosity;
          uVar8 = 0xffffffff;
          if (0 < (int)VVar10) {
            (this->spxout).m_verbosity = WARNING;
            soplex::operator<<(&this->spxout,"Converting number greater than UINT_MAX to uint.\n");
            (this->spxout).m_verbosity = VVar10;
          }
        }
        setRandomSeed(this,(uint)uVar8);
        return true;
      }
      VVar10 = (this->spxout).m_verbosity;
      if ((int)VVar10 < 3) {
        return false;
      }
      pSVar5 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar11 = "Error parsing setting string for uint parameter <random_seed>.\n";
      goto LAB_001a01d8;
    }
    VVar10 = (this->spxout).m_verbosity;
    if ((int)VVar10 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar5 = soplex::operator<<(&this->spxout,
                                "Error parsing setting string: invalid parameter type <");
    pSVar5 = soplex::operator<<(pSVar5,(char *)t);
    pcVar11 = "> for parameter <";
  }
LAB_001a08d4:
  pSVar5 = soplex::operator<<(pSVar5,pcVar11);
  pSVar5 = soplex::operator<<(pSVar5,(char *)__s1);
  pcVar11 = ">.\n";
LAB_001a01d8:
  soplex::operator<<(pSVar5,pcVar11);
LAB_001a0231:
  (this->spxout).m_verbosity = VVar10;
  return false;
}

Assistant:

bool SoPlexBase<R>::parseSettingsString(char* string)
{
   assert(string != nullptr);

   bool success = true;

   if(string == nullptr)
      return false;

   char parseString[SPX_SET_MAX_LINE_LEN];
   spxSnprintf(parseString, SPX_SET_MAX_LINE_LEN - 1, "%s", string);

   char* line = parseString;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing setting string: no ':' separating parameter type and name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter name.\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no '=' after parameter name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter value.\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: additional character '" << *line <<
                       "' after parameter value.\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a real parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;
#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for real parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << ">.\n");

   return false;
}